

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<VariableTypeRemap,_8UL>::SmallVector
          (SmallVector<VariableTypeRemap,_8UL> *this)

{
  VariableTypeRemap *pVVar1;
  SmallVector<VariableTypeRemap,_8UL> *this_local;
  
  VectorView<VariableTypeRemap>::VectorView(&this->super_VectorView<VariableTypeRemap>);
  this->buffer_capacity = 0;
  pVVar1 = AlignedBuffer<VariableTypeRemap,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<VariableTypeRemap>).ptr = pVVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}